

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O3

void __thiscall cmCPackLog::~cmCPackLog(cmCPackLog *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCPackLog_0060c560;
  if ((this->LogOutputCleanup == true) && (this->LogOutput != (ostream *)0x0)) {
    (*this->LogOutput->_vptr_basic_ostream[1])();
  }
  this->LogOutputCleanup = false;
  this->LogOutput = (ostream *)0x0;
  pcVar1 = (this->LogOutputFileName)._M_dataplus._M_p;
  paVar2 = &(this->LogOutputFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->ErrorPrefix)._M_dataplus._M_p;
  paVar2 = &(this->ErrorPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->WarningPrefix)._M_dataplus._M_p;
  paVar2 = &(this->WarningPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->DebugPrefix)._M_dataplus._M_p;
  paVar2 = &(this->DebugPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->VerbosePrefix)._M_dataplus._M_p;
  paVar2 = &(this->VerbosePrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->OutputPrefix)._M_dataplus._M_p;
  paVar2 = &(this->OutputPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->Prefix)._M_dataplus._M_p;
  paVar2 = &(this->Prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmCPackLog::~cmCPackLog()
{
  this->SetLogOutputStream(0);
}